

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ASTBuilder.cpp
# Opt level: O2

void __thiscall AST::ASTBuilder::handle(ASTBuilder *this,string *action,string *LHS)

{
  bool bVar1;
  string action_number;
  string arg;
  
  if (this->isIgnoreModeOn == false) {
    std::__cxx11::string::substr((ulong)&action_number,(ulong)action);
    bVar1 = std::operator==(&action_number,"@1");
    if (bVar1) {
      if (action->_M_string_length < 3) {
        createNode(this,LHS);
      }
      else {
        std::__cxx11::string::substr((ulong)&arg,(ulong)action);
        createNode(this,&arg);
        std::__cxx11::string::~string((string *)&arg);
      }
    }
    else {
      bVar1 = std::operator==(&action_number,"@2");
      if (bVar1) {
        insertRightChild(this);
      }
      else {
        bVar1 = std::operator==(&action_number,"@3");
        if (bVar1) {
          adoptChild(this);
        }
        else {
          bVar1 = std::operator==(&action_number,"@4");
          if (bVar1) {
            insertLeftChild(this);
          }
          else {
            bVar1 = std::operator==(&action_number,"@5");
            if (bVar1) {
              constructListAndInsertAsChild(this);
            }
            else {
              bVar1 = std::operator==(&action_number,"@6");
              if (bVar1) {
                std::deque<AST::ASTNode_*,_std::allocator<AST::ASTNode_*>_>::pop_back
                          (&(this->stack).c);
              }
              else {
                removeSelfIfOnlyHasOneChild(this);
              }
            }
          }
        }
      }
    }
    std::__cxx11::string::~string((string *)&action_number);
  }
  return;
}

Assistant:

void AST::ASTBuilder::handle(std::string &action, std::string &LHS) {
    if (isIgnoreModeOn) return;
    std::string action_number = action.substr(0, 2);
    if (action_number == "@1") {
        //Extract #optiona_custom_name for the AST node.
        if (action.size() > 2) {
            std::string arg = action.substr(4);
            createNode(arg);
        } else createNode(LHS);
    } else if (action_number == "@2") insertRightChild();
    else if (action_number == "@3") adoptChild();
    else if (action_number == "@4") insertLeftChild();
    else if (action_number == "@5") constructListAndInsertAsChild();
    else if (action_number == "@6") stack.pop();
    else removeSelfIfOnlyHasOneChild();
}